

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# divceil.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  unsigned_long uVar1;
  char *pcVar2;
  typed_value<unsigned_long,_char> *ptVar3;
  typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
  *ptVar4;
  typed_value<boost::tuples::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type>,_char>
  *ptVar5;
  size_type sVar6;
  ostream *this;
  variable_value *pvVar7;
  unsigned_long *puVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar9;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type>
  *ptVar10;
  non_const_type divisor_type;
  test_call_type p_Var11;
  non_const_type plVar12;
  error *e;
  test_call_type test;
  string local_320;
  undefined1 local_300 [8];
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type>
  divisor;
  string local_2d0;
  undefined1 local_2b0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> integer_type;
  string local_288;
  unsigned_long local_268;
  unsigned_long attempts;
  key_type local_258;
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_238;
  basic_parsed_options<char> local_210;
  variables_map local_1e8 [8];
  variables_map vm;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  local_1d8 [148];
  int local_144;
  cons<const_char_(&)[6],_boost::tuples::cons<int,_boost::tuples::null_type>_> local_140;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type>
  local_130;
  allocator<char> local_101;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  unsigned_long local_e0;
  undefined8 local_d8 [3];
  allocator<char> local_b9;
  string local_b8 [32];
  options_description local_98 [8];
  options_description description;
  char **argv_local;
  int argc_local;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_b8,anon_var_dwarf_1c483,&local_b9);
  boost::program_options::options_description::options_description
            (local_98,local_b8,
             (uint)boost::program_options::options_description::m_default_line_length,
             (uint)boost::program_options::options_description::m_default_line_length >> 1);
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator(&local_b9);
  local_d8[0] = boost::program_options::options_description::add_options();
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             ((char *)local_d8,"help,h");
  ptVar3 = boost::program_options::value<unsigned_long>();
  local_e0 = 1000;
  ptVar3 = boost::program_options::typed_value<unsigned_long,_char>::default_value(ptVar3,&local_e0)
  ;
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar2,(value_semantic *)"attempts",(char *)ptVar3);
  ptVar4 = boost::program_options::value<std::__cxx11::string>();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_100,"int32",&local_101);
  ptVar4 = boost::program_options::
           typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
           ::default_value(ptVar4,&local_100);
  pcVar2 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar2,(value_semantic *)"integer",(char *)ptVar4);
  ptVar5 = boost::program_options::
           value<boost::tuples::tuple<std::__cxx11::string,long,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>>
                     ();
  local_144 = 100;
  boost::tuples::make_tuple<char[6],int>((tuples *)&local_140,(char (*) [6])0x134022,&local_144);
  boost::tuples::
  tuple<std::__cxx11::string,long,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>
  ::tuple<char_const(&)[6],boost::tuples::cons<int,boost::tuples::null_type>>
            ((tuple<std::__cxx11::string,long,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>
              *)&local_130,&local_140);
  ptVar5 = boost::program_options::
           typed_value<boost::tuples::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type>,_char>
           ::default_value(ptVar5,&local_130);
  boost::program_options::options_description_easy_init::operator()
            (pcVar2,(value_semantic *)"divisor",(char *)ptVar5);
  boost::tuples::
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type>
  ::~tuple(&local_130);
  std::__cxx11::string::~string((string *)&local_100);
  std::allocator<char>::~allocator(&local_101);
  boost::program_options::variables_map::variables_map(local_1e8);
  local_238.super_function_base.functor._8_8_ = 0;
  local_238.super_function_base.functor._16_8_ = 0;
  local_238.super_function_base.vtable = (vtable_base *)0x0;
  local_238.super_function_base.functor.members.obj_ptr = (obj_ptr_t)0x0;
  boost::
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::function1(&local_238);
  boost::program_options::parse_command_line<char>(&local_210,argc,argv,local_98,0,&local_238);
  boost::program_options::store((basic_parsed_options *)&local_210,local_1e8,false);
  boost::program_options::basic_parsed_options<char>::~basic_parsed_options(&local_210);
  boost::
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~function1(&local_238);
  boost::program_options::notify(local_1e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_258,"help",(allocator<char> *)((long)&attempts + 7));
  sVar6 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::count(local_1d8,&local_258);
  std::__cxx11::string::~string((string *)&local_258);
  std::allocator<char>::~allocator((allocator<char> *)((long)&attempts + 7));
  if (sVar6 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_288,"attempts",
               (allocator<char> *)(integer_type.field_2._M_local_buf + 0xf));
    pvVar7 = boost::program_options::variables_map::operator[](local_1e8,&local_288);
    puVar8 = boost::program_options::variable_value::as<unsigned_long>(pvVar7);
    uVar1 = *puVar8;
    std::__cxx11::string::~string((string *)&local_288);
    std::allocator<char>::~allocator((allocator<char> *)(integer_type.field_2._M_local_buf + 0xf));
    local_268 = uVar1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2d0,"integer",
               (allocator<char> *)((long)&divisor.super_type.tail.head + 7));
    pvVar7 = boost::program_options::variables_map::operator[](local_1e8,&local_2d0);
    pbVar9 = boost::program_options::variable_value::as<std::__cxx11::string>(pvVar7);
    std::__cxx11::string::string((string *)local_2b0,(string *)pbVar9);
    std::__cxx11::string::~string((string *)&local_2d0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&divisor.super_type.tail.head + 7));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_320,"divisor",(allocator<char> *)((long)&test + 7));
    pvVar7 = boost::program_options::variables_map::operator[](local_1e8,&local_320);
    ptVar10 = boost::program_options::variable_value::
              as<boost::tuples::tuple<std::__cxx11::string,long,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>>
                        (pvVar7);
    boost::tuples::
    tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type>
    ::tuple((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type>
             *)local_300,ptVar10);
    std::__cxx11::string::~string((string *)&local_320);
    std::allocator<char>::~allocator((allocator<char> *)((long)&test + 7));
    divisor_type = boost::tuples::
                   get<0,std::__cxx11::string,boost::tuples::cons<long,boost::tuples::null_type>>
                             ((cons<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::tuples::cons<long,_boost::tuples::null_type>_>
                               *)local_300);
    p_Var11 = get_call((string *)local_2b0,divisor_type);
    plVar12 = boost::tuples::
              get<1,std::__cxx11::string,boost::tuples::cons<long,boost::tuples::null_type>>
                        ((cons<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::tuples::cons<long,_boost::tuples::null_type>_>
                          *)local_300);
    (*p_Var11)(*plVar12,local_268);
    boost::tuples::
    tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type>
    ::~tuple((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type>
              *)local_300);
    std::__cxx11::string::~string((string *)local_2b0);
  }
  else {
    this = (ostream *)boost::program_options::operator<<((ostream *)&std::cout,local_98);
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  }
  boost::program_options::variables_map::~variables_map(local_1e8);
  boost::program_options::options_description::~options_description(local_98);
  return 0;
}

Assistant:

int main (int argc, const char * argv[])
{
    namespace bpo = boost::program_options;

    bpo::options_description description("Опции");
    description.add_options()
        ("help,h", "Подсказка.")
        ("attempts", bpo::value<std::size_t>()->default_value(1000),
            "Количество испытаний.")
        ("integer", bpo::value<std::string>()->default_value("int32"),
            "Тип сортируемых чисел.\n"
            "Допустимые значения: uint8, uint16, uint32, uint64, int8, int16, int32, int64")
        ("divisor", bpo::value<boost::tuple<std::string, std::int64_t>>()->default_value(boost::make_tuple("int32", 100)),
            "Тип делителя.\n"
            "Допустимые значения: uint8, uint16, uint32, uint64, int8, int16, int32, int64");

    try
    {
        bpo::variables_map vm;
        bpo::store(bpo::parse_command_line(argc, argv, description), vm);
        bpo::notify(vm);

        if (vm.count("help"))
        {
            std::cout << description << std::endl;
        }
        else
        {
            auto attempts = vm["attempts"].as<std::size_t>();
            auto integer_type = vm["integer"].as<std::string>();
            auto divisor = vm["divisor"].as<boost::tuple<std::string, std::int64_t>>();

            auto test = get_call(integer_type, boost::get<0>(divisor));
            test(boost::get<1>(divisor), attempts);
        }
    }
    catch (bpo::error & e)
    {
        std::cout << e.what() << std::endl;
        std::cout << description << std::endl;
    }
}